

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O0

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  bool bVar1;
  string *in_RDI;
  string local_f0 [8];
  int *in_stack_ffffffffffffff18;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  *(undefined ***)in_RDI = &PTR__DeathTestImpl_001c0668;
  do {
    bVar1 = IsTrue(*(int *)&in_RDI[1].field_0x4 == -1);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_c8,"CHECK failed: File ",&local_c9);
      std::operator+(&local_a8,&local_c8,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O0/deps/googletest/src/googletest_project/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_88,&local_a8,", line ");
      StreamableToString<int>(in_stack_ffffffffffffff18);
      std::operator+(&local_68,&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0);
      std::operator+(&local_48,&local_68,": ");
      std::operator+(&local_28,&local_48,"read_fd_ == -1");
      DeathTestAbort(in_RDI);
      std::__cxx11::string::~string((string *)&local_28);
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  DeathTest::~DeathTest((DeathTest *)in_RDI);
  return;
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }